

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O0

MPP_RET h265d_parse(void *ctx,HalDecTask *task)

{
  HEVCContext *s_00;
  RK_S32 RVar1;
  HEVCContext *s;
  H265dContext_t *h265dctx;
  MPP_RET ret;
  HalDecTask *task_local;
  void *ctx_local;
  
  s_00 = *ctx;
  task->valid = 0;
  s_00->got_frame = 0;
  s_00->task = task;
  s_00->ref = (HEVCFrame *)0x0;
  RVar1 = parser_nal_units(s_00);
  if (RVar1 < 0) {
    if (RVar1 == -0x3ec) {
      _mpp_log_l(4,"H265D_PARSER","current stream is no right skip it %p\n",(char *)0x0,s_00->ref);
    }
    (task->flags).val = (task->flags).val & 0xfffffffffffffffb | 4;
  }
  if ((h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265D_PARSER","decode poc = %d",(char *)0x0,(ulong)(uint)s_00->poc);
  }
  if (s_00->ref != (HEVCFrame *)0x0) {
    if (((task->flags).val >> 2 & 1) == 0) {
      h265d_parser2_syntax(ctx);
    }
    (s_00->task->syntax).data = s_00->hal_pic_private;
    (s_00->task->syntax).number = 1;
    s_00->task->valid = 1;
    s_00->ps_need_upate = '\0';
  }
  if (s_00->eos != 0) {
    h265d_flush(ctx);
    (s_00->task->flags).val = (s_00->task->flags).val & 0xfffffffffffffffe | 1;
  }
  s_00->nb_frame = s_00->nb_frame + 1;
  if (s_00->is_decoded != 0) {
    if ((h265d_debug & 0x40) != 0) {
      _mpp_log_l(4,"H265D_PARSER","Decoded frame with POC %d.\n",(char *)0x0,(ulong)(uint)s_00->poc)
      ;
    }
    s_00->is_decoded = 0;
  }
  mpp_hevc_output_frame(ctx,0);
  return MPP_OK;
}

Assistant:

MPP_RET h265d_parse(void *ctx, HalDecTask *task)
{
    MPP_RET ret;
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = h265dctx->priv_data;

    task->valid = 0;
    s->got_frame = 0;
    s->task = task;
    s->ref = NULL;
    ret    = parser_nal_units(s);
    if (ret < 0) {
        if (ret ==  MPP_ERR_STREAM) {
            mpp_log("current stream is no right skip it %p\n", s->ref);
            ret = 0;
        }
        // return ret;
        task->flags.parse_err = 1;
    }
    h265d_dbg(H265D_DBG_GLOBAL, "decode poc = %d", s->poc);
    if (s->ref) {
        if (!task->flags.parse_err)
            h265d_parser2_syntax(h265dctx);

        s->task->syntax.data = s->hal_pic_private;
        s->task->syntax.number = 1;
        s->task->valid = 1;
        s->ps_need_upate = 0;
    }
    if (s->eos) {
        h265d_flush(ctx);
        s->task->flags.eos = 1;
    }
    s->nb_frame++;
    if (s->is_decoded) {
        h265d_dbg(H265D_DBG_GLOBAL, "Decoded frame with POC %d.\n", s->poc);
        s->is_decoded = 0;
    }
    mpp_hevc_output_frame(ctx, 0);
    return MPP_OK;
}